

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printLabel(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  Value *local_18;
  Ref node_local;
  
  local_18 = node.inst;
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_18);
  if (*(int *)*puVar2 == 0) {
    emit(this,*(char **)((int *)*puVar2 + 4));
    space(this);
    maybeSpace(this,':');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = ':';
    space(this);
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_18);
    print(this,(Value *)*puVar2);
    return;
  }
  __assert_fail("isString()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0xeb,"const char *cashew::Value::getCString()");
}

Assistant:

void printLabel(Ref node) {
    emit(node[1]->getCString());
    space();
    emit(':');
    space();
    print(node[2]);
  }